

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
hta::storage::file::Metric::find_index
          (Metric *this,TimePoint begin,TimePoint end,IntervalScope scope)

{
  int iVar1;
  int extraout_var;
  int64_t iVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  pair<unsigned_long,_unsigned_long> pVar5;
  long sz;
  
  if ((((long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) && (scope.begin != infinity)) && (scope.end != infinity)) {
    throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
              ("storage::file::Metric::find_index invalid request: begin timestamp ",
               (time_point)
               begin.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r," larger than end timestamp ",
               (time_point)
               end.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r);
  }
  iVar1 = (*(this->super_Metric)._vptr_Metric[10])(this);
  sz = CONCAT44(extraout_var,iVar1);
  if (sz == 0) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    switch((ulong)scope & 0xffffffff) {
    case 0:
      iVar2 = find_index_before_or_on(this,begin,sz);
      uVar3 = (ulong)(iVar2 < sz) + iVar2;
      break;
    case 1:
      uVar3 = find_index_on_or_after(this,begin,sz);
      break;
    case 2:
      uVar4 = find_index_before_or_on(this,begin,sz);
      uVar3 = 0;
      if (0 < (long)uVar4) {
        uVar3 = uVar4;
      }
      break;
    case 3:
      uVar3 = 0;
    }
    if (scope.end < 4) {
      pVar5 = (pair<unsigned_long,_unsigned_long>)
              (*(code *)(&DAT_0017c908 + *(int *)(&DAT_0017c908 + ((ulong)scope >> 0x20) * 4)))();
      return pVar5;
    }
    if ((long)uVar3 < 0) {
      __assert_fail("index_begin >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x140,
                    "std::pair<uint64_t, uint64_t> hta::storage::file::Metric::find_index(TimePoint, TimePoint, IntervalScope)"
                   );
    }
    if (sz < (long)uVar3) {
      __assert_fail("index_begin <= sz",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x141,
                    "std::pair<uint64_t, uint64_t> hta::storage::file::Metric::find_index(TimePoint, TimePoint, IntervalScope)"
                   );
    }
    uVar4 = (ulong)(-1 < extraout_var) - 1;
    if ((long)uVar4 < 0) {
      __assert_fail("index_end >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x142,
                    "std::pair<uint64_t, uint64_t> hta::storage::file::Metric::find_index(TimePoint, TimePoint, IntervalScope)"
                   );
    }
    if (sz < (long)uVar4) {
      __assert_fail("index_end <= sz",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x143,
                    "std::pair<uint64_t, uint64_t> hta::storage::file::Metric::find_index(TimePoint, TimePoint, IntervalScope)"
                   );
    }
    if ((long)uVar4 < (long)uVar3) {
      __assert_fail("index_begin <= index_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x144,
                    "std::pair<uint64_t, uint64_t> hta::storage::file::Metric::find_index(TimePoint, TimePoint, IntervalScope)"
                   );
    }
  }
  pVar5.second = uVar4;
  pVar5.first = uVar3;
  return pVar5;
}

Assistant:

std::pair<uint64_t, uint64_t> Metric::find_index(TimePoint begin, TimePoint end,
                                                 IntervalScope scope)
{
    if (begin > end && scope.begin != Scope::infinity && scope.end != Scope::infinity)
    {
        throw_exception("storage::file::Metric::find_index invalid request: begin timestamp ",
                        begin, " larger than end timestamp ", end);
    }
    // Must be signed for comparision
    const auto sz = static_cast<int64_t>(size());
    if (sz == 0)
    {
        return { 0, 0 };
    }

    // We initialize so we don't get uninitialized
    int64_t index_begin = -1;
    /* this is the index of the end _element_ (not after!) according to scope.end
     * It may be out of scope (==size()) in some cases */
    int64_t index_end = -1;
    // This is quite complex and possibly bad for performance
    // TODO optimize // simplify
    switch (scope.begin)
    {
    case Scope::closed:
        index_begin = find_index_on_or_after(begin, sz);
        break;
    case Scope::open:
        index_begin = find_index_before_or_on(begin, sz);
        if (index_begin < sz)
        {
            index_begin++;
        }
        break;
    case Scope::extended:
        index_begin = find_index_before_or_on(begin, sz);
        index_begin = std::max<decltype(index_begin)>(index_begin, 0);
        break;
    case Scope::infinity:
        index_begin = 0;
        break;
    }

    switch (scope.end)
    {
    case Scope::closed:
        index_end = find_index_before_or_on(end, sz);
        break;
    case Scope::open:
        index_end = find_index_on_or_after(end, sz);
        index_end--;
        break;
    case Scope::extended:
        index_end = find_index_on_or_after(end, sz);
        break;
    case Scope::infinity:
        index_end = sz - 1;
        break;
    }
    // Move index_end to *after* the last included element... if not already outside.
    if (index_end < sz)
    {
        index_end++;
    }

    assert(index_begin >= 0);
    assert(index_begin <= sz);
    assert(index_end >= 0);
    assert(index_end <= sz);
    assert(index_begin <= index_end);

    return { index_begin, index_end };
}